

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::setFocusItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,FocusReason focusReason,
          bool emitFocusChanged)

{
  bool bVar1;
  Int IVar2;
  QGraphicsItem *_t1;
  QCoreApplication *pQVar3;
  QGraphicsItem *pQVar4;
  undefined1 in_CL;
  FocusReason in_EDX;
  QGraphicsScenePrivate *in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *oldFocusItem;
  QGraphicsScene *q;
  QFocusEvent event_1;
  QFocusEvent event;
  GraphicsItemFlag in_stack_ffffffffffffff7c;
  undefined6 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff86;
  byte bVar5;
  FocusReason _t3;
  QGraphicsItem *in_stack_ffffffffffffff90;
  QGraphicsItem *_t2;
  undefined3 in_stack_ffffffffffffffa0;
  uint uVar6;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_44;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_40;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_CL,in_stack_ffffffffffffffa0) & 0x1ffffff;
  _t1 = (QGraphicsItem *)q_func(in_RDI);
  if (in_RSI != (QGraphicsScenePrivate *)in_RDI->focusItem) {
    bVar5 = 0;
    if (in_RSI != (QGraphicsScenePrivate *)0x0) {
      local_40.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QGraphicsItem::flags
                     ((QGraphicsItem *)
                      (ulong)CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80));
      local_3c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                     ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                      CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                      in_stack_ffffffffffffff7c);
      bVar1 = QFlags<QGraphicsItem::GraphicsItemFlag>::operator!
                        ((QFlags<QGraphicsItem::GraphicsItemFlag> *)&local_3c);
      in_stack_ffffffffffffff86 = 1;
      bVar5 = in_stack_ffffffffffffff86;
      if (!bVar1) {
        bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9c5b7e);
        in_stack_ffffffffffffff86 = 1;
        bVar5 = in_stack_ffffffffffffff86;
        if (bVar1) {
          bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9c5b97);
          in_stack_ffffffffffffff86 = bVar1 ^ 0xff;
          bVar5 = in_stack_ffffffffffffff86;
        }
      }
    }
    if ((bVar5 & 1) != 0) {
      in_RSI = (QGraphicsScenePrivate *)0x0;
    }
    if ((in_RSI == (QGraphicsScenePrivate *)0x0) ||
       (QGraphicsScene::setFocus
                  ((QGraphicsScene *)in_stack_ffffffffffffff90,(FocusReason)((ulong)in_RDI >> 0x20))
       , in_RSI != (QGraphicsScenePrivate *)in_RDI->focusItem)) {
      _t2 = in_RDI->focusItem;
      if (in_RDI->focusItem != (QGraphicsItem *)0x0) {
        in_RDI->lastFocusItem = in_RDI->focusItem;
        QGraphicsItem::flags
                  ((QGraphicsItem *)
                   CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
        local_44.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                        CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)
                                ),in_stack_ffffffffffffff7c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
        if ((IVar2 != 0) &&
           (pQVar3 = QCoreApplication::instance(), pQVar3 != (QCoreApplication *)0x0)) {
          QGuiApplication::inputMethod();
          QInputMethod::commit();
        }
        in_RDI->focusItem = (QGraphicsItem *)0x0;
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusOut,in_EDX);
        sendEvent(in_RSI,(QGraphicsItem *)CONCAT44(in_EDX,uVar6),(QEvent *)_t1);
        QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
      }
      if ((in_RSI != (QGraphicsScenePrivate *)0x0) &&
         (pQVar4 = (QGraphicsItem *)QGraphicsItem::scene((QGraphicsItem *)0x9c5d04), pQVar4 != _t1))
      {
        in_RSI = (QGraphicsScenePrivate *)0x0;
      }
      if (in_RSI != (QGraphicsScenePrivate *)0x0) {
        in_RDI->focusItem = (QGraphicsItem *)in_RSI;
      }
      updateInputMethodSensitivityInViews
                ((QGraphicsScenePrivate *)
                 CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
      _t3 = (FocusReason)((ulong)in_RDI >> 0x20);
      if (in_RSI != (QGraphicsScenePrivate *)0x0) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusIn,in_EDX);
        sendEvent(in_RSI,(QGraphicsItem *)CONCAT44(in_EDX,uVar6),(QEvent *)_t1);
        QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
      }
      if ((uVar6 & 0x1000000) != 0) {
        QGraphicsScene::focusItemChanged
                  ((QGraphicsScene *)
                   CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),_t1
                   ,_t2,_t3);
      }
    }
    else if ((uVar6 & 0x1000000) != 0) {
      QGraphicsScene::focusItemChanged
                ((QGraphicsScene *)
                 CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),_t1,
                 in_stack_ffffffffffffff90,(FocusReason)((ulong)in_RDI >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setFocusItemHelper(QGraphicsItem *item,
                                               Qt::FocusReason focusReason,
                                               bool emitFocusChanged)
{
    Q_Q(QGraphicsScene);
    if (item == focusItem)
        return;

    // Clear focus if asked to set focus on something that can't
    // accept input focus.
    if (item && (!(item->flags() & QGraphicsItem::ItemIsFocusable)
                 || !item->isVisible() || !item->isEnabled())) {
        item = nullptr;
    }

    // Set focus on the scene if an item requests focus.
    if (item) {
        q->setFocus(focusReason);
        if (item == focusItem) {
            if (emitFocusChanged)
                emit q->focusItemChanged(focusItem, (QGraphicsItem *)nullptr, focusReason);
            return;
        }
    }

    QGraphicsItem *oldFocusItem = focusItem;
    if (focusItem) {
        lastFocusItem = focusItem;

#ifndef QT_NO_IM
        if (lastFocusItem->flags() & QGraphicsItem::ItemAcceptsInputMethod) {
            // Close any external input method panel. This happens
            // automatically by removing WA_InputMethodEnabled on
            // the views, but if we are changing focus, we have to
            // do it ourselves.
            if (qApp)
                QGuiApplication::inputMethod()->commit();
        }
#endif //QT_NO_IM

        focusItem = nullptr;
        QFocusEvent event(QEvent::FocusOut, focusReason);
        sendEvent(lastFocusItem, &event);
    }

    // This handles the case that the item has been removed from the
    // scene in response to the FocusOut event.
    if (item && item->scene() != q)
        item = nullptr;

    if (item)
        focusItem = item;
    updateInputMethodSensitivityInViews();

    if (item) {
        QFocusEvent event(QEvent::FocusIn, focusReason);
        sendEvent(item, &event);
    }

    if (emitFocusChanged)
        emit q->focusItemChanged(focusItem, oldFocusItem, focusReason);
}